

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PaddingLayerParams::PaddingLayerParams
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  bool bVar1;
  PaddingTypeCase PVar2;
  InternalMetadataWithArenaLite *this_00;
  BorderAmounts *this_01;
  PaddingLayerParams_PaddingConstant *this_02;
  PaddingLayerParams_PaddingConstant *from_00;
  PaddingLayerParams_PaddingReflection *this_03;
  PaddingLayerParams_PaddingReflection *from_01;
  PaddingLayerParams_PaddingReplication *this_04;
  PaddingLayerParams_PaddingReplication *from_02;
  PaddingLayerParams *from_local;
  PaddingLayerParams *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PaddingLayerParams_00627fc0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  PaddingTypeUnion::PaddingTypeUnion((PaddingTypeUnion *)&this->PaddingType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_paddingamounts(from);
  if (bVar1) {
    this_01 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_01,from->paddingamounts_);
    this->paddingamounts_ = this_01;
  }
  else {
    this->paddingamounts_ = (BorderAmounts *)0x0;
  }
  clear_has_PaddingType(this);
  PVar2 = PaddingType_case(from);
  switch(PVar2) {
  case PADDINGTYPE_NOT_SET:
    break;
  case kConstant:
    this_02 = mutable_constant(this);
    from_00 = constant(from);
    PaddingLayerParams_PaddingConstant::MergeFrom(this_02,from_00);
    break;
  case kReflection:
    this_03 = mutable_reflection(this);
    from_01 = reflection(from);
    PaddingLayerParams_PaddingReflection::MergeFrom(this_03,from_01);
    break;
  case kReplication:
    this_04 = mutable_replication(this);
    from_02 = replication(from);
    PaddingLayerParams_PaddingReplication::MergeFrom(this_04,from_02);
  }
  return;
}

Assistant:

PaddingLayerParams::PaddingLayerParams(const PaddingLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_paddingamounts()) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts(*from.paddingamounts_);
  } else {
    paddingamounts_ = NULL;
  }
  clear_has_PaddingType();
  switch (from.PaddingType_case()) {
    case kConstant: {
      mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from.constant());
      break;
    }
    case kReflection: {
      mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from.reflection());
      break;
    }
    case kReplication: {
      mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from.replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PaddingLayerParams)
}